

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

TestCase *
vkt::pipeline::anon_unknown_0::newTestCase<vkt::pipeline::(anonymous_namespace)::BasicGraphicsTest>
          (TestContext *testContext,TimestampTestParam *testParam)

{
  TimestampTest *this;
  allocator<char> local_9a;
  allocator<char> local_99;
  long *local_98 [2];
  long local_88 [2];
  string *local_78 [2];
  string local_68;
  long local_48 [2];
  string *local_38 [2];
  _Alloc_hider local_28;
  
  this = (TimestampTest *)operator_new(0x90);
  (**testParam->_vptr_TimestampTestParam)(&local_68.field_2,testParam);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,(char *)local_68.field_2._M_allocated_capacity,&local_99);
  (*testParam->_vptr_TimestampTestParam[1])(local_98,testParam);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,(char *)local_98[0],&local_9a);
  TimestampTest::TimestampTest(this,testContext,local_38[0],local_78[0],testParam);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TimestampTest_00d26bc0;
  if (local_78[0] != &local_68) {
    operator_delete(local_78[0],(ulong)(local_68._M_dataplus._M_p + 1));
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if (local_38[0] != (string *)&local_28) {
    operator_delete(local_38[0],(ulong)(local_28._M_p + 1));
  }
  if ((long *)local_68.field_2._M_allocated_capacity != local_48) {
    operator_delete((void *)local_68.field_2._M_allocated_capacity,local_48[0] + 1);
  }
  return &this->super_TestCase;
}

Assistant:

vkt::TestCase* newTestCase(tcu::TestContext&     testContext,
						   TimestampTestParam*   testParam)
{
	return new Test(testContext,
					testParam->generateTestName().c_str(),
					testParam->generateTestDescription().c_str(),
					testParam);
}